

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSpecification.cpp
# Opt level: O1

void __thiscall
DIS::RecordSpecification::unmarshal(RecordSpecification *this,DataStream *dataStream)

{
  uint *d;
  pointer *ppRVar1;
  pointer pRVar2;
  pointer pRVar3;
  iterator __position;
  pointer pRVar4;
  ulong uVar5;
  RecordSpecificationElement x;
  RecordSpecificationElement local_48;
  
  d = &this->_numberOfRecordSets;
  DataStream::operator>>(dataStream,d);
  pRVar2 = (this->_recordSets).
           super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (this->_recordSets).
           super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar4 = pRVar2;
  if (pRVar3 != pRVar2) {
    do {
      (**pRVar4->_vptr_RecordSpecificationElement)(pRVar4);
      pRVar4 = pRVar4 + 1;
    } while (pRVar4 != pRVar3);
    (this->_recordSets).
    super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar2;
  }
  if (*d != 0) {
    uVar5 = 0;
    do {
      RecordSpecificationElement::RecordSpecificationElement(&local_48);
      RecordSpecificationElement::unmarshal(&local_48,dataStream);
      __position._M_current =
           (this->_recordSets).
           super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_recordSets).
          super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::RecordSpecificationElement,std::allocator<DIS::RecordSpecificationElement>>
        ::_M_realloc_insert<DIS::RecordSpecificationElement_const&>
                  ((vector<DIS::RecordSpecificationElement,std::allocator<DIS::RecordSpecificationElement>>
                    *)&this->_recordSets,__position,&local_48);
      }
      else {
        (__position._M_current)->_vptr_RecordSpecificationElement =
             (_func_int **)&PTR__RecordSpecificationElement_001b5b30;
        (__position._M_current)->_recordID = local_48._recordID;
        (__position._M_current)->_recordSetSerialNumber =
             (int)(CONCAT17(local_48._recordSetSerialNumber._3_1_,local_48._8_7_) >> 0x20);
        *(ulong *)((long)&(__position._M_current)->_recordSetSerialNumber + 3) =
             CONCAT71(local_48._16_7_,local_48._recordSetSerialNumber._3_1_);
        ppRVar1 = &(this->_recordSets).
                   super__Vector_base<DIS::RecordSpecificationElement,_std::allocator<DIS::RecordSpecificationElement>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
      }
      RecordSpecificationElement::~RecordSpecificationElement(&local_48);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *d);
  }
  return;
}

Assistant:

void RecordSpecification::unmarshal(DataStream& dataStream)
{
    dataStream >> _numberOfRecordSets;

     _recordSets.clear();
     for(size_t idx = 0; idx < _numberOfRecordSets; idx++)
     {
        RecordSpecificationElement x;
        x.unmarshal(dataStream);
        _recordSets.push_back(x);
     }
}